

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

Matrix * Matrix::identity(Matrix *__return_storage_ptr__,int dimensions)

{
  vector<float,_std::allocator<float>_> *this;
  reference pvVar1;
  undefined4 local_44;
  undefined4 local_20;
  undefined4 local_1c;
  int j;
  int i;
  int dimensions_local;
  Matrix *E;
  
  Matrix(__return_storage_ptr__,dimensions,dimensions);
  for (local_1c = 0; local_1c < dimensions; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < dimensions; local_20 = local_20 + 1) {
      local_44 = 1.0;
      if (local_1c != local_20) {
        local_44 = 0.0;
      }
      this = operator[](__return_storage_ptr__,local_1c);
      pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](this,(long)local_20);
      *pvVar1 = local_44;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix Matrix::identity(int dimensions) {
    Matrix E(dimensions, dimensions);
    for (int i = 0; i < dimensions; i++) {
        for (int j = 0; j < dimensions; j++) {
            E[i][j] = (i == j ? 1.f : 0.f);
        }
    }
    return E;
}